

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::~IfcZone(IfcZone *this)

{
  ~IfcZone((IfcZone *)&this[-1].super_IfcGroup.super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}